

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::ReduceRightHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  RecyclableObject *pRVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  Var pvVar7;
  RecyclableObject *callBackFn;
  undefined4 extraout_var;
  ulong uVar8;
  undefined4 *puVar9;
  undefined8 uVar10;
  JavascriptMethod p_Var11;
  ulong uVar12;
  uint64 uVar13;
  uint64 uVar14;
  char16_t *varName;
  ulong start;
  long lVar15;
  double value;
  undefined1 auVar16 [16];
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  Var local_48;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00b9c3b4:
    varName = L"[TypedArray].prototype.reduceRight";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.reduceRight";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar7 = Arguments::operator[](args,1);
  bVar3 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar3) goto LAB_00b9c3b4;
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar3 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    if (bVar3) {
      typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
      typedArrayBase = (TypedArrayBase *)0x0;
    }
  }
  pvVar7 = Arguments::operator[](args,1);
  callBackFn = VarTo<Js::RecyclableObject>(pvVar7);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    if (length == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,(PCWSTR)0x0);
    }
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      uVar13 = length - 1;
      start = 1;
      jsReentLock._24_8_ = typedArrayBase;
      do {
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar6 = JavascriptOperators::HasItem(obj,uVar13);
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        if (BVar6 != 0) {
          *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          local_48 = JavascriptOperators::GetItem(obj,uVar13,scriptContext);
          JsReentLock::MutateArrayObject((JsReentLock *)local_78);
          *(bool *)((long)local_78 + 0x108) = true;
          typedArrayBase = (TypedArrayBase *)jsReentLock._24_8_;
          goto LAB_00b9c0e9;
        }
        uVar13 = uVar13 - 1;
        bVar3 = start < length;
        start = start + 1;
      } while (bVar3);
LAB_00b9c0a1:
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,(PCWSTR)0x0);
    }
    bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
    if (!bVar3) {
      bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
      if (bVar3) {
LAB_00b9c409:
        Throw::FatalInternalError(-0x7fffbffb);
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2832,"(VarIsCorrectType(typedArrayBase))",
                                  "VarIsCorrectType(typedArrayBase)");
      if (bVar3) {
        *puVar9 = 0;
        goto LAB_00b9c409;
      }
      goto LAB_00b9c4bd;
    }
    if ((typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length == 0) goto LAB_00b9c0a1;
    iVar5 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,(ulong)((int)length - 1));
    local_48 = (Var)CONCAT44(extraout_var,iVar5);
    start = 1;
  }
  else {
    local_48 = Arguments::operator[](args,2);
    start = 0;
LAB_00b9c0e9:
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      local_48 = ReduceRightObjectHelper<unsigned_long>
                           (obj,length,start,callBackFn,local_48,scriptContext);
      goto LAB_00b9c38c;
    }
  }
  pRVar1 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
  if (!bVar3) {
    bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2856,"(VarIsCorrectType(typedArrayBase))",
                                  "VarIsCorrectType(typedArrayBase)");
      if (!bVar3) {
LAB_00b9c4bd:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    Throw::FatalInternalError(-0x7fffbffb);
  }
  uVar8 = (ulong)(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
  if (length <= uVar8) {
    uVar8 = length;
  }
  if (start < uVar8) {
    jsReentLock._24_8_ = typedArrayBase;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    lVar15 = 0;
    do {
      uVar10 = (**(code **)(*(long *)jsReentLock._24_8_ + 0x390))
                         (jsReentLock._24_8_,~(uint)start + (int)length + (int)lVar15);
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      this = scriptContext->threadContext;
      bVar3 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      if (scriptContext->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var11 = RecyclableObject::GetEntryPoint(callBackFn);
      CheckIsExecutable(callBackFn,p_Var11);
      p_Var11 = RecyclableObject::GetEntryPoint(callBackFn);
      uVar12 = (length - start) + -1 + lVar15;
      if (uVar12 < 0x80000000) {
        uVar12 = (length - start) + 0xffffffffffff + lVar15;
      }
      else {
        auVar16._8_4_ = (int)(uVar12 >> 0x20);
        auVar16._0_8_ = uVar12;
        auVar16._12_4_ = 0x45300000;
        value = ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0) +
                (auVar16._8_8_ - 1.9342813113834067e+25);
        uVar13 = NumberUtilities::ToSpecial(value);
        bVar4 = NumberUtilities::IsNan(value);
        if (((bVar4) && (uVar14 = NumberUtilities::ToSpecial(value), uVar14 != 0xfff8000000000000))
           && (uVar14 = NumberUtilities::ToSpecial(value), uVar14 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar4) goto LAB_00b9c4bd;
          *puVar9 = 0;
        }
        uVar12 = uVar13 ^ 0xfffc000000000000;
      }
      local_48 = (*p_Var11)(callBackFn,(CallInfo)callBackFn,0x2000005,0,0,0,0,0x2000005,pRVar1,
                            local_48,uVar10,uVar12,jsReentLock._24_8_);
      this->reentrancySafeOrHandled = bVar3;
      JsReentLock::MutateArrayObject((JsReentLock *)local_78);
      *(bool *)((long)local_78 + 0x108) = true;
      lVar15 = lVar15 + -1;
    } while (start - uVar8 != lVar15);
  }
LAB_00b9c38c:
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_48;
}

Assistant:

Var JavascriptArray::ReduceRightHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.reduceRight"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.reduceRight"));
            }
        }

        // If we came from Array.prototype.reduceRight and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var accumulator = nullptr;
        Var element = nullptr;
        T k = 0;
        T index = 0;

        if (args.Info.Count > 2)
        {
            accumulator = args[2];
        }
        else
        {
            if (length == 0)
            {
                JavascriptError::ThrowTypeError(scriptContext, VBSERR_ActionNotSupported);
            }

            bool bPresent = false;
            if (typedArrayBase)
            {
                AssertAndFailFast(VarIsCorrectType(typedArrayBase));
                uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

                for (; k < end && bPresent == false; k++)
                {
                    // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                    index = length - k - 1;
                    element = typedArrayBase->DirectGetItem((uint32)index);
                    bPresent = true;
                    accumulator = element;
                }
            }
            else
            {
                for (; k < length && bPresent == false; k++)
                {
                    index = length - k - 1;
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, index));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, accumulator = JavascriptOperators::GetItem(obj, index, scriptContext));
                        bPresent = true;
                    }
                }
            }
            if (bPresent == false)
            {
                JavascriptError::ThrowTypeError(scriptContext, VBSERR_ActionNotSupported);
            }
        }

        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                index = length - k - 1;
                element = typedArrayBase->DirectGetItem((uint32)index);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 5), undefinedValue,
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(index, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceRightObjectHelper<T>(obj, length, k, callBackFn, accumulator, scriptContext));
        }

        return accumulator;
    }